

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

void __thiscall
proto2_unittest::TestMutualRecursionA_SubMessage::~TestMutualRecursionA_SubMessage
          (TestMutualRecursionA_SubMessage *this)

{
  ~TestMutualRecursionA_SubMessage(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestMutualRecursionA_SubMessage::~TestMutualRecursionA_SubMessage() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestMutualRecursionA.SubMessage)
  SharedDtor(*this);
}